

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

void bits2int(uECC_word_t *native,uint8_t *bits,uint bits_size,uECC_Curve curve)

{
  ulong *puVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  uECC_word_t *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint num_bytes;
  int iVar11;
  
  iVar10 = (int)curve->num_n_bits;
  iVar11 = iVar10 + 0xe;
  if (-1 < iVar10 + 7) {
    iVar11 = iVar10 + 7;
  }
  uVar6 = iVar10 + 0x3fU;
  if ((int)(iVar10 + 0x3fU) < 0) {
    uVar6 = iVar10 + 0x7eU;
  }
  uVar6 = (int)uVar6 >> 6;
  num_bytes = iVar11 >> 3;
  if (bits_size <= (uint)(iVar11 >> 3)) {
    num_bytes = bits_size;
  }
  if ('\0' < (char)uVar6) {
    memset(native,0,(ulong)((uVar6 & 0x7f) << 3));
  }
  uECC_vli_bytesToNative(native,bits,num_bytes);
  iVar11 = num_bytes * 8 - (int)curve->num_n_bits;
  if ((uint)(int)curve->num_n_bits <= num_bytes * 8 && iVar11 != 0) {
    if (0x7e < iVar10 + 0x7eU) {
      puVar5 = native + uVar6;
      bVar2 = (byte)iVar11;
      uVar9 = 0;
      do {
        uVar4 = puVar5[-1];
        puVar5[-1] = uVar4 >> (bVar2 & 0x3f) | uVar9;
        uVar9 = uVar4 << (0x40 - bVar2 & 0x3f);
        puVar5 = puVar5 + -1;
      } while (native < puVar5);
    }
    uVar9 = (ulong)(uVar6 & 0xff);
    do {
      uVar9 = uVar9 - 1;
      if ((char)uVar9 < '\0') break;
      uVar7 = (ulong)(((uint)uVar9 & 0x7f) << 3);
      uVar4 = *(ulong *)((long)curve->n + uVar7);
      uVar7 = *(ulong *)((long)native + uVar7);
      if (uVar7 < uVar4) {
        bVar3 = true;
        goto LAB_001069a2;
      }
    } while (uVar7 <= uVar4);
    bVar3 = false;
LAB_001069a2:
    if ('\0' < (char)uVar6 && !bVar3) {
      uVar4 = 0;
      uVar9 = 0;
      do {
        uVar8 = curve->n[uVar4] + uVar9;
        puVar1 = native + uVar4;
        uVar7 = *puVar1;
        *puVar1 = *puVar1 - uVar8;
        if (uVar8 != 0) {
          uVar9 = (ulong)(uVar7 < uVar8);
        }
        uVar4 = uVar4 + 1;
      } while ((uVar6 & 0xff) != uVar4);
    }
  }
  return;
}

Assistant:

static void bits2int(uECC_word_t *native,
                     const uint8_t *bits,
                     unsigned bits_size,
                     uECC_Curve curve) {
    unsigned num_n_bytes = BITS_TO_BYTES(curve->num_n_bits);
    unsigned num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    int shift;
    uECC_word_t carry;
    uECC_word_t *ptr;

    if (bits_size > num_n_bytes) {
        bits_size = num_n_bytes;
    }

    uECC_vli_clear(native, num_n_words);
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) native, bits, bits_size);
#else
    uECC_vli_bytesToNative(native, bits, bits_size);
#endif
    if (bits_size * 8 <= (unsigned)curve->num_n_bits) {
        return;
    }
    shift = bits_size * 8 - curve->num_n_bits;
    carry = 0;
    ptr = native + num_n_words;
    while (ptr-- > native) {
        uECC_word_t temp = *ptr;
        *ptr = (temp >> shift) | carry;
        carry = temp << (uECC_WORD_BITS - shift);
    }

    /* Reduce mod curve_n */
    if (uECC_vli_cmp_unsafe(curve->n, native, num_n_words) != 1) {
        uECC_vli_sub(native, native, curve->n, num_n_words);
    }
}